

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::
     log<char_const(&)[130],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [130],
               UnionState *params_1,UnionState *params_2)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  UnionState *params_00;
  UnionState *params_01;
  long lVar3;
  ArrayPtr<kj::String> in_stack_ffffffffffffff88;
  undefined8 uStack_68;
  String local_60;
  String local_48;
  
  str<char_const(&)[130]>
            ((String *)&stack0xffffffffffffff88,(kj *)CONCAT44(in_register_00000014,severity),
             (char (*) [130])CONCAT44(in_register_00000014,severity));
  str<capnp::_::(anonymous_namespace)::UnionState&>(&local_60,(kj *)macroArgs,params_00);
  str<capnp::_::(anonymous_namespace)::UnionState&>(&local_48,(kj *)params,params_01);
  logInternal((Debug *)
              "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
              ,(char *)((ulong)file & 0xffffffff),2,line,&stack0xffffffffffffff88,
              in_stack_ffffffffffffff88);
  lVar3 = 0x30;
  do {
    lVar1 = *(long *)(&stack0xffffffffffffff88 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(&stack0xffffffffffffff90 + lVar3);
      *(undefined8 *)(&stack0xffffffffffffff88 + lVar3) = 0;
      *(undefined8 *)(&stack0xffffffffffffff90 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&uStack_68 + lVar3))
                (*(undefined8 **)((long)&uStack_68 + lVar3),lVar1,1,uVar2,uVar2,0);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}